

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::Promise<unsigned_long>_>::truncate
          (ArrayBuilder<kj::Promise<unsigned_long>_> *this,char *__file,__off_t __length)

{
  Promise<unsigned_long> *pPVar1;
  PromiseArenaMember *node;
  Promise<unsigned_long> *pPVar2;
  Promise<unsigned_long> *in_RAX;
  
  pPVar1 = this->ptr;
  pPVar2 = this->pos;
  while (pPVar1 + (long)__file < pPVar2) {
    in_RAX = pPVar2 + -1;
    this->pos = in_RAX;
    node = &(pPVar2[-1].super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    pPVar2 = in_RAX;
    if (node != (PromiseArenaMember *)0x0) {
      (in_RAX->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(node);
      pPVar2 = this->pos;
      in_RAX = pPVar2;
    }
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }